

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fMultisampleShaderRenderCase.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::MultisampleRenderCase
          (MultisampleRenderCase *this,Context *context,char *name,char *desc,int numSamples,
          RenderTarget target,int renderSize,int flags)

{
  bool local_31;
  RenderTarget target_local;
  int numSamples_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  MultisampleRenderCase *this_local;
  
  gles31::TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__MultisampleRenderCase_032b8b10;
  this->m_numRequestedSamples = numSamples;
  this->m_renderTarget = target;
  this->m_renderSize = renderSize;
  this->m_perIterationShader = (flags & 1U) != 0;
  local_31 = (flags & 2U) != 0 && target == TARGET_TEXTURE;
  this->m_verifyTextureSampleBuffers = local_31;
  this->m_numTargetSamples = -1;
  this->m_buffer = 0;
  this->m_resolveBuffer = 0;
  this->m_program = (ShaderProgram *)0x0;
  this->m_fbo = 0;
  this->m_fboTexture = 0;
  this->m_textureSamplerProgram = (ShaderProgram *)0x0;
  this->m_fboRbo = 0;
  this->m_resolveFbo = 0;
  this->m_resolveFboTexture = 0;
  this->m_iteration = 0;
  this->m_numIterations = 1;
  this->m_renderMode = 0;
  this->m_renderCount = 0;
  this->m_renderVao = 0;
  this->m_resolveVao = 0;
  std::__cxx11::string::string((string *)&this->m_renderSceneDescription);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_deqp::gles31::Functional::MultisampleShaderRenderUtil::MultisampleRenderCase::Attrib>_>_>
  ::map(&this->m_renderAttribs);
  return;
}

Assistant:

MultisampleRenderCase::MultisampleRenderCase (Context& context, const char* name, const char* desc, int numSamples, RenderTarget target, int renderSize, int flags)
	: TestCase						(context, name, desc)
	, m_numRequestedSamples			(numSamples)
	, m_renderTarget				(target)
	, m_renderSize					(renderSize)
	, m_perIterationShader			((flags & FLAG_PER_ITERATION_SHADER) != 0)
	, m_verifyTextureSampleBuffers	((flags & FLAG_VERIFY_MSAA_TEXTURE_SAMPLE_BUFFERS) != 0 && target == TARGET_TEXTURE)
	, m_numTargetSamples			(-1)
	, m_buffer						(0)
	, m_resolveBuffer				(0)
	, m_program						(DE_NULL)
	, m_fbo							(0)
	, m_fboTexture					(0)
	, m_textureSamplerProgram		(DE_NULL)
	, m_fboRbo						(0)
	, m_resolveFbo					(0)
	, m_resolveFboTexture			(0)
	, m_iteration					(0)
	, m_numIterations				(1)
	, m_renderMode					(0)
	, m_renderCount					(0)
	, m_renderVao					(0)
	, m_resolveVao					(0)
{
	DE_ASSERT(target < TARGET_LAST);
}